

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

char * __thiscall
adios2::format::BP5Serializer::BuildVarName
          (BP5Serializer *this,char *base_name,ShapeID Shape,int type,int element_size)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__s_00;
  uint in_ECX;
  ShapeID in_EDX;
  char *in_RSI;
  uint in_R8D;
  char *Ret;
  size_t Len;
  char *Prefix;
  
  __s = NamePrefix(in_EDX);
  sVar1 = strlen(in_RSI);
  sVar2 = strlen(__s);
  sVar1 = sVar1 + sVar2 + 0x12;
  __s_00 = (char *)malloc(sVar1);
  if (in_R8D == 0) {
    strcpy(__s_00,__s);
    strcat(__s_00,"_");
    strcat(__s_00,in_RSI);
  }
  else {
    snprintf(__s_00,sVar1,"%s_%d_%d_",__s,(ulong)in_R8D,(ulong)in_ECX);
    strcat(__s_00,in_RSI);
  }
  return __s_00;
}

Assistant:

char *BP5Serializer::BuildVarName(const char *base_name, const ShapeID Shape, const int type,
                                  const int element_size)
{

    const char *Prefix = NamePrefix(Shape);
    auto Len = strlen(base_name) + 2 + strlen(Prefix) + 16;
    char *Ret = (char *)malloc(Len);
    if (element_size == 0)
    {
        strcpy(Ret, Prefix);
        strcat(Ret, "_");
        strcat(Ret, base_name);
    }
    else
    {
        snprintf(Ret, Len, "%s_%d_%d_", Prefix, element_size, type);
        strcat(Ret, base_name);
    }
    return Ret;
}